

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * google::protobuf::internal::NameOfEnum_abi_cxx11_(EnumDescriptor *descriptor,int value)

{
  EnumValueDescriptor *pEVar1;
  string *psVar2;
  
  pEVar1 = EnumDescriptor::FindValueByNumber(descriptor,value);
  if (pEVar1 != (EnumValueDescriptor *)0x0) {
    return *(string **)pEVar1;
  }
  psVar2 = GetEmptyString_abi_cxx11_();
  return psVar2;
}

Assistant:

const string& NameOfEnum(const EnumDescriptor* descriptor, int value) {
  const EnumValueDescriptor* d = descriptor->FindValueByNumber(value);
  return (d == NULL ? GetEmptyString() : d->name());
}